

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  stbi__uint32 *y_00;
  int *comp_00;
  anon_struct_96_18_0d0905d3 *paVar1;
  undefined8 *puVar2;
  char cVar3;
  uchar uVar4;
  undefined1 uVar5;
  short sVar6;
  ushort uVar7;
  undefined8 uVar8;
  double dVar9;
  long lVar10;
  short sVar11;
  bool bVar12;
  byte bVar13;
  byte bVar14;
  stbi_uc sVar15;
  stbi_uc sVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  int iVar20;
  stbi__uint32 sVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  stbi__uint32 sVar25;
  stbi__uint32 sVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  stbi__jpeg *psVar30;
  char *pcVar31;
  long lVar32;
  float *data_00;
  stbi_uc *psVar33;
  uchar *puVar34;
  void *pvVar35;
  code *pcVar36;
  stbi__context *data_01;
  undefined8 *puVar37;
  stbi_uc *psVar38;
  undefined8 *puVar39;
  ulong uVar40;
  undefined1 *puVar41;
  short sVar42;
  float *pfVar43;
  stbi__uint16 *psVar44;
  int id;
  stbi__context *psVar45;
  int iVar46;
  int iVar47;
  ulong uVar48;
  long lVar49;
  undefined4 in_register_00000084;
  anon_struct_96_18_0d0905d3 *paVar50;
  stbi__result_info *ri_00;
  int iVar51;
  uint uVar52;
  int iVar53;
  uint uVar54;
  stbi_uc *pal_entry;
  ulong uVar55;
  ulong uVar56;
  stbi_uc *psVar57;
  void *pvVar58;
  byte *pbVar59;
  stbi_uc **ppsVar60;
  uint uVar61;
  uint uVar62;
  short *psVar63;
  stbi__uint16 *psVar64;
  long in_FS_OFFSET;
  bool bVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar68 [16];
  int local_8974;
  stbi__uint16 *local_8968;
  uint local_8960;
  float *local_8920;
  uint local_8904;
  uint local_8900;
  int local_88fc;
  stbi_uc *coutput [4];
  int local_88d8;
  uint local_88b4;
  short data [64];
  
  psVar38 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  psVar30 = (stbi__jpeg *)malloc(0x4888);
  psVar30->s = s;
  psVar30->idct_block_kernel = stbi__idct_simd;
  psVar30->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar30->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  iVar20 = stbi__decode_jpeg_header(psVar30,1);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar30);
  if (iVar20 != 0) {
    psVar30 = (stbi__jpeg *)malloc(0x4888);
    psVar30->s = s;
    psVar30->idct_block_kernel = stbi__idct_simd;
    psVar30->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar30->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    data._8_8_ = psVar30;
    if ((uint)req_comp < 5) {
      for (lVar32 = 0x46d8; lVar32 != 0x4858; lVar32 = lVar32 + 0x60) {
        psVar38 = psVar30->huff_dc[0].fast + lVar32 + -8;
        psVar38[0] = '\0';
        psVar38[1] = '\0';
        psVar38[2] = '\0';
        psVar38[3] = '\0';
        psVar38[4] = '\0';
        psVar38[5] = '\0';
        psVar38[6] = '\0';
        psVar38[7] = '\0';
        psVar38[8] = '\0';
        psVar38[9] = '\0';
        psVar38[10] = '\0';
        psVar38[0xb] = '\0';
        psVar38[0xc] = '\0';
        psVar38[0xd] = '\0';
        psVar38[0xe] = '\0';
        psVar38[0xf] = '\0';
      }
      psVar30->restart_interval = 0;
      iVar20 = stbi__decode_jpeg_header(psVar30,0);
      if (iVar20 != 0) {
        paVar1 = psVar30->img_comp;
        bVar13 = stbi__get_marker(psVar30);
LAB_0012df20:
        if (bVar13 != 0xda) {
          if (bVar13 == 0xdc) {
            iVar20 = stbi__get16be(psVar30->s);
            sVar21 = stbi__get16be(psVar30->s);
            if (iVar20 == 4) {
              if (sVar21 == psVar30->s->img_y) goto LAB_0012df83;
              pcVar31 = "bad DNL height";
            }
            else {
              pcVar31 = "bad DNL len";
            }
            goto LAB_0012f5c0;
          }
          if (bVar13 != 0xd9) {
            iVar20 = stbi__process_marker(psVar30,(uint)bVar13);
            if (iVar20 != 0) goto LAB_0012df83;
            goto LAB_0012f5c9;
          }
          if (psVar30->progressive == 0) {
            psVar45 = psVar30->s;
            uVar61 = psVar45->img_n;
          }
          else {
            lVar32 = 0;
            while( true ) {
              psVar45 = psVar30->s;
              uVar61 = psVar45->img_n;
              if ((int)uVar61 <= lVar32) break;
              uVar61 = psVar30->img_comp[lVar32].x + 7 >> 3;
              iVar20 = psVar30->img_comp[lVar32].y + 7 >> 3;
              iVar53 = 0;
              if ((int)uVar61 < 1) {
                uVar61 = 0;
              }
              if (iVar20 < 1) {
                iVar20 = 0;
              }
              for (; iVar53 != iVar20; iVar53 = iVar53 + 1) {
                for (uVar56 = 0; uVar56 != uVar61; uVar56 = uVar56 + 1) {
                  psVar63 = paVar1[lVar32].coeff;
                  iVar46 = paVar1[lVar32].coeff_w * iVar53;
                  iVar51 = paVar1[lVar32].tq;
                  iVar47 = iVar46 + (int)uVar56;
                  for (lVar49 = 0; lVar49 != 0x40; lVar49 = lVar49 + 1) {
                    psVar63[iVar47 * 0x40 + lVar49] =
                         psVar63[iVar47 * 0x40 + lVar49] * psVar30->dequant[iVar51][lVar49];
                  }
                  (*psVar30->idct_block_kernel)
                            (paVar1[lVar32].data +
                             uVar56 * 8 + (long)(iVar53 * 8 * paVar1[lVar32].w2),paVar1[lVar32].w2,
                             psVar63 + (iVar46 + (int)uVar56) * 0x40);
                }
              }
              lVar32 = lVar32 + 1;
            }
          }
          uVar52 = (2 < (int)uVar61) + 1 + (uint)(2 < (int)uVar61);
          if (req_comp != 0) {
            uVar52 = req_comp;
          }
          lVar32 = 0;
          bVar65 = false;
          if ((uVar61 == 3) && (bVar65 = true, psVar30->rgb != 3)) {
            if (psVar30->app14_color_transform == 0) {
              bVar65 = psVar30->jfif == 0;
            }
            else {
              bVar65 = false;
            }
          }
          uVar56 = 0;
          if (0 < (int)uVar61) {
            uVar56 = (ulong)uVar61;
          }
          uVar48 = 1;
          if (bVar65) {
            uVar48 = uVar56;
          }
          if (2 < (int)uVar52) {
            uVar48 = uVar56;
          }
          coutput[2] = (stbi_uc *)0x0;
          coutput[3] = (stbi_uc *)0x0;
          coutput[0] = (stbi_uc *)0x0;
          coutput[1] = (stbi_uc *)0x0;
          if (uVar61 != 3) {
            uVar48 = uVar56;
          }
          do {
            if (uVar48 * 0x30 == lVar32) {
              sVar21 = psVar45->img_y;
              data_01 = (stbi__context *)stbi__malloc_mad3(uVar52,psVar45->img_x,sVar21,1);
              if (data_01 != (stbi__context *)0x0) {
                iVar20 = 0;
                uVar61 = 0;
                do {
                  if (sVar21 <= uVar61) {
                    stbi__cleanup_jpeg(psVar30);
                    psVar45 = psVar30->s;
                    *x = psVar45->img_x;
                    *y = psVar45->img_y;
                    if (comp != (int *)0x0) {
                      *comp = (uint)(2 < psVar45->img_n) * 2 + 1;
                    }
                    goto LAB_0012f5d8;
                  }
                  sVar21 = psVar45->img_x;
                  ppsVar60 = coutput;
                  for (lVar32 = 0; uVar48 * 0x30 != lVar32; lVar32 = lVar32 + 0x30) {
                    puVar37 = (undefined8 *)((long)data + lVar32 + 0x10);
                    iVar53 = *(int *)((long)data + lVar32 + 0x24);
                    iVar51 = *(int *)((long)data + lVar32 + 0x1c);
                    iVar46 = iVar51 >> 1;
                    puVar2 = (undefined8 *)((long)data + lVar32 + 8);
                    puVar39 = puVar37;
                    if (iVar53 < iVar46) {
                      puVar39 = puVar2;
                    }
                    if (iVar46 <= iVar53) {
                      puVar37 = puVar2;
                    }
                    psVar38 = (stbi_uc *)
                              (**(code **)((long)data + lVar32))
                                        (*(undefined8 *)
                                          ((long)&psVar30->img_comp[0].linebuf + lVar32 * 2),
                                         *puVar39,*puVar37,
                                         *(undefined4 *)((long)data + lVar32 + 0x20));
                    *ppsVar60 = psVar38;
                    *(int *)((long)data + lVar32 + 0x24) = iVar53 + 1;
                    if (iVar51 <= iVar53 + 1) {
                      *(undefined4 *)((long)data + lVar32 + 0x24) = 0;
                      lVar49 = *(long *)((long)data + lVar32 + 0x10);
                      *(long *)((long)data + lVar32 + 8) = lVar49;
                      iVar53 = *(int *)((long)data + lVar32 + 0x28) + 1;
                      *(int *)((long)data + lVar32 + 0x28) = iVar53;
                      if (iVar53 < *(int *)((long)&psVar30->img_comp[0].y + lVar32 * 2)) {
                        *(long *)((long)data + lVar32 + 0x10) =
                             lVar49 + *(int *)((long)&psVar30->img_comp[0].w2 + lVar32 * 2);
                      }
                    }
                    ppsVar60 = ppsVar60 + 1;
                  }
                  if ((int)uVar52 < 3) {
                    psVar45 = psVar30->s;
                    if (bVar65) {
                      if (uVar52 == 1) {
                        for (uVar56 = 0; uVar56 < psVar45->img_x; uVar56 = uVar56 + 1) {
                          data_01->buffer_start[uVar56 + sVar21 * iVar20 + -0x38] =
                               (stbi_uc)((uint)coutput[2][uVar56] * 0x1d +
                                         (uint)coutput[1][uVar56] * 0x96 +
                                         (uint)coutput[0][uVar56] * 0x4d >> 8);
                        }
                      }
                      else {
                        for (uVar56 = 0; uVar56 < psVar45->img_x; uVar56 = uVar56 + 1) {
                          data_01->buffer_start[uVar56 * 2 + (ulong)(sVar21 * iVar20) + -0x38] =
                               (stbi_uc)((uint)coutput[2][uVar56] * 0x1d +
                                         (uint)coutput[1][uVar56] * 0x96 +
                                         (uint)coutput[0][uVar56] * 0x4d >> 8);
                          data_01->buffer_start[uVar56 * 2 + (ulong)(sVar21 * iVar20) + -0x37] =
                               0xff;
                        }
                      }
                    }
                    else if (psVar45->img_n == 4) {
                      if (psVar30->app14_color_transform == 2) {
                        psVar38 = data_01->buffer_start + ((ulong)(sVar21 * iVar20) - 0x37);
                        for (uVar56 = 0; uVar56 < psVar45->img_x; uVar56 = uVar56 + 1) {
                          iVar53 = (coutput[0][uVar56] ^ 0xff) * (uint)coutput[3][uVar56];
                          psVar38[-1] = (char)((iVar53 + 0x80U >> 8) + iVar53 + 0x80 >> 8);
                          *psVar38 = 0xff;
                          psVar38 = psVar38 + uVar52;
                        }
                      }
                      else {
                        if (psVar30->app14_color_transform != 0) goto LAB_0012fff9;
                        psVar38 = data_01->buffer_start + ((ulong)(sVar21 * iVar20) - 0x37);
                        for (uVar56 = 0; uVar56 < psVar45->img_x; uVar56 = uVar56 + 1) {
                          bVar13 = coutput[3][uVar56];
                          iVar53 = (uint)coutput[0][uVar56] * (uint)bVar13;
                          iVar51 = (uint)coutput[1][uVar56] * (uint)bVar13;
                          psVar38[-1] = (char)((((uint)coutput[2][uVar56] * (uint)bVar13 + 0x80 >> 8
                                                ) + (uint)coutput[2][uVar56] * (uint)bVar13 + 0x80
                                               >> 8) * 0x1d +
                                               (iVar51 + (iVar51 + 0x80U >> 8) + 0x80 >> 8) * 0x96 +
                                               (iVar53 + (iVar53 + 0x80U >> 8) + 0x80 >> 8) * 0x4d
                                              >> 8);
                          *psVar38 = 0xff;
                          psVar38 = psVar38 + uVar52;
                        }
                      }
                    }
                    else {
LAB_0012fff9:
                      if (uVar52 == 1) {
                        for (uVar56 = 0; uVar56 < psVar45->img_x; uVar56 = uVar56 + 1) {
                          data_01->buffer_start[uVar56 + sVar21 * iVar20 + -0x38] =
                               coutput[0][uVar56];
                        }
                      }
                      else {
                        for (uVar56 = 0; uVar56 < psVar45->img_x; uVar56 = uVar56 + 1) {
                          data_01->buffer_start[uVar56 * 2 + (ulong)(sVar21 * iVar20) + -0x38] =
                               coutput[0][uVar56];
                          data_01->buffer_start[uVar56 * 2 + (ulong)(sVar21 * iVar20) + -0x37] =
                               0xff;
                        }
                      }
                    }
                  }
                  else {
                    psVar45 = psVar30->s;
                    if (psVar45->img_n == 3) {
                      if (bVar65) {
                        psVar38 = data_01->buffer_start + ((ulong)(sVar21 * iVar20) - 0x35);
                        for (uVar56 = 0; uVar56 < psVar45->img_x; uVar56 = uVar56 + 1) {
                          psVar38[-3] = coutput[0][uVar56];
                          psVar38[-2] = coutput[1][uVar56];
                          psVar38[-1] = coutput[2][uVar56];
                          *psVar38 = 0xff;
                          psVar38 = psVar38 + uVar52;
                        }
                      }
                      else {
LAB_00130034:
                        (*psVar30->YCbCr_to_RGB_kernel)
                                  (data_01->buffer_start +
                                   ((ulong)(uVar61 * uVar52 * sVar21) - 0x38),coutput[0],coutput[1],
                                   coutput[2],psVar45->img_x,uVar52);
                      }
                    }
                    else if (psVar45->img_n == 4) {
                      if (psVar30->app14_color_transform == 2) {
                        (*psVar30->YCbCr_to_RGB_kernel)
                                  (data_01->buffer_start +
                                   ((ulong)(uVar61 * uVar52 * sVar21) - 0x38),coutput[0],coutput[1],
                                   coutput[2],psVar45->img_x,uVar52);
                        psVar45 = psVar30->s;
                        psVar38 = data_01->buffer_start + ((ulong)(sVar21 * iVar20) - 0x36);
                        for (uVar56 = 0; uVar56 < psVar45->img_x; uVar56 = uVar56 + 1) {
                          bVar13 = coutput[3][uVar56];
                          iVar53 = (psVar38[-2] ^ 0xff) * (uint)bVar13;
                          psVar38[-2] = (byte)((iVar53 + 0x80U >> 8) + iVar53 + 0x80 >> 8);
                          iVar53 = (psVar38[-1] ^ 0xff) * (uint)bVar13;
                          psVar38[-1] = (byte)((iVar53 + 0x80U >> 8) + iVar53 + 0x80 >> 8);
                          iVar53 = (*psVar38 ^ 0xff) * (uint)bVar13;
                          *psVar38 = (byte)((iVar53 + 0x80U >> 8) + iVar53 + 0x80 >> 8);
                          psVar38 = psVar38 + uVar52;
                        }
                      }
                      else {
                        if (psVar30->app14_color_transform != 0) goto LAB_00130034;
                        psVar38 = data_01->buffer_start + ((ulong)(sVar21 * iVar20) - 0x35);
                        for (uVar56 = 0; uVar56 < psVar45->img_x; uVar56 = uVar56 + 1) {
                          bVar13 = coutput[3][uVar56];
                          iVar53 = (uint)coutput[0][uVar56] * (uint)bVar13;
                          psVar38[-3] = (char)((iVar53 + 0x80U >> 8) + iVar53 + 0x80 >> 8);
                          iVar53 = (uint)coutput[1][uVar56] * (uint)bVar13;
                          psVar38[-2] = (char)((iVar53 + 0x80U >> 8) + iVar53 + 0x80 >> 8);
                          psVar38[-1] = (char)(((uint)coutput[2][uVar56] * (uint)bVar13 + 0x80 >> 8)
                                               + (uint)coutput[2][uVar56] * (uint)bVar13 + 0x80 >> 8
                                              );
                          *psVar38 = 0xff;
                          psVar38 = psVar38 + uVar52;
                        }
                      }
                    }
                    else {
                      psVar38 = data_01->buffer_start + ((ulong)(sVar21 * iVar20) - 0x35);
                      for (uVar56 = 0; uVar56 < psVar45->img_x; uVar56 = uVar56 + 1) {
                        sVar15 = coutput[0][uVar56];
                        psVar38[-1] = sVar15;
                        psVar38[-2] = sVar15;
                        psVar38[-3] = sVar15;
                        *psVar38 = 0xff;
                        psVar38 = psVar38 + uVar52;
                      }
                    }
                  }
                  uVar61 = uVar61 + 1;
                  psVar45 = psVar30->s;
                  sVar21 = psVar45->img_y;
                  iVar20 = iVar20 + uVar52;
                } while( true );
              }
              stbi__cleanup_jpeg(psVar30);
LAB_00130206:
              pcVar31 = "outofmem";
              goto LAB_0012de3d;
            }
            sVar21 = psVar45->img_x;
            pvVar35 = malloc((ulong)(sVar21 + 3));
            *(void **)((long)&psVar30->img_comp[0].linebuf + lVar32 * 2) = pvVar35;
            if (pvVar35 == (void *)0x0) {
              stbi__cleanup_jpeg(psVar30);
              goto LAB_00130206;
            }
            uVar56 = (long)psVar30->img_h_max /
                     (long)*(int *)((long)&psVar30->img_comp[0].h + lVar32 * 2);
            iVar20 = (int)uVar56;
            *(int *)((long)data + lVar32 + 0x18) = iVar20;
            iVar53 = psVar30->img_v_max / *(int *)((long)&psVar30->img_comp[0].v + lVar32 * 2);
            *(int *)((long)data + lVar32 + 0x1c) = iVar53;
            *(int *)((long)data + lVar32 + 0x24) = iVar53 >> 1;
            *(int *)((long)data + lVar32 + 0x20) =
                 (int)((ulong)((iVar20 + sVar21) - 1) / (uVar56 & 0xffffffff));
            *(undefined4 *)((long)data + lVar32 + 0x28) = 0;
            uVar8 = *(undefined8 *)((long)&psVar30->img_comp[0].data + lVar32 * 2);
            *(undefined8 *)((long)data + lVar32 + 0x10) = uVar8;
            *(undefined8 *)((long)data + lVar32 + 8) = uVar8;
            if (iVar20 == 2) {
              pcVar36 = stbi__resample_row_h_2;
              if (iVar53 != 1) {
                if (iVar53 != 2) goto LAB_0012fb36;
                pcVar36 = psVar30->resample_row_hv_2_kernel;
              }
            }
            else if (iVar20 == 1) {
              pcVar36 = stbi__resample_row_generic;
              if (iVar53 == 2) {
                pcVar36 = stbi__resample_row_v_2;
              }
              if (iVar53 == 1) {
                pcVar36 = resample_row_1;
              }
            }
            else {
LAB_0012fb36:
              pcVar36 = stbi__resample_row_generic;
            }
            *(code **)((long)data + lVar32) = pcVar36;
            lVar32 = lVar32 + 0x30;
          } while( true );
        }
        iVar20 = stbi__get16be(psVar30->s);
        bVar13 = stbi__get8(psVar30->s);
        uVar61 = (uint)bVar13;
        psVar30->scan_n = (uint)bVar13;
        if (((byte)(bVar13 - 5) < 0xfc) ||
           (psVar45 = psVar30->s, psVar45->img_n < (int)(uint)bVar13)) {
          pcVar31 = "bad SOS component count";
        }
        else {
          if (iVar20 != (uint)bVar13 * 2 + 6) {
            pcVar31 = "bad SOS len";
            goto LAB_0012f5c0;
          }
          lVar32 = 0;
          while( true ) {
            bVar13 = stbi__get8(psVar45);
            if ((int)uVar61 <= lVar32) break;
            bVar14 = stbi__get8(psVar30->s);
            psVar45 = psVar30->s;
            uVar61 = psVar45->img_n;
            uVar56 = 0;
            if (0 < (int)uVar61) {
              uVar56 = (ulong)uVar61;
            }
            paVar50 = paVar1;
            for (uVar48 = 0; uVar56 != uVar48; uVar48 = uVar48 + 1) {
              if (paVar50->id == (uint)bVar13) {
                uVar56 = uVar48 & 0xffffffff;
                break;
              }
              paVar50 = paVar50 + 1;
            }
            if ((uint)uVar56 == uVar61) goto LAB_0012f5c9;
            psVar30->img_comp[uVar56].hd = (uint)(bVar14 >> 4);
            if (0x3f < bVar14) {
              pcVar31 = "bad DC huff";
              goto LAB_0012f5c0;
            }
            paVar1[uVar56].ha = bVar14 & 0xf;
            if (3 < (bVar14 & 0xf)) {
              pcVar31 = "bad AC huff";
              goto LAB_0012f5c0;
            }
            psVar30->order[lVar32] = (uint)uVar56;
            lVar32 = lVar32 + 1;
            uVar61 = psVar30->scan_n;
          }
          psVar30->spec_start = (uint)bVar13;
          bVar13 = stbi__get8(psVar30->s);
          psVar30->spec_end = (uint)bVar13;
          bVar13 = stbi__get8(psVar30->s);
          psVar30->succ_high = (uint)(bVar13 >> 4);
          psVar30->succ_low = bVar13 & 0xf;
          iVar20 = psVar30->spec_start;
          if (psVar30->progressive == 0) {
            if (((iVar20 == 0) && (bVar13 < 0x10)) && ((bVar13 & 0xf) == 0)) {
              psVar30->spec_end = 0x3f;
              goto LAB_0012e121;
            }
          }
          else if (((iVar20 < 0x40) && (psVar30->spec_end < 0x40)) &&
                  ((iVar20 <= psVar30->spec_end && ((bVar13 < 0xe0 && ((bVar13 & 0xf) < 0xe)))))) {
LAB_0012e121:
            stbi__jpeg_reset(psVar30);
            if (psVar30->progressive == 0) {
              if (psVar30->scan_n == 1) {
                iVar20 = psVar30->order[0];
                uVar61 = psVar30->img_comp[iVar20].x + 7 >> 3;
                iVar53 = psVar30->img_comp[iVar20].y + 7 >> 3;
                if ((int)uVar61 < 1) {
                  uVar61 = 0;
                }
                local_8974 = 0;
                if (iVar53 < 1) {
                  iVar53 = 0;
                }
                for (iVar51 = 0; iVar51 != iVar53; iVar51 = iVar51 + 1) {
                  for (lVar32 = 0; (ulong)uVar61 * 8 != lVar32; lVar32 = lVar32 + 8) {
                    iVar46 = stbi__jpeg_decode_block
                                       (psVar30,data,
                                        (stbi__huffman *)psVar30->huff_dc[paVar1[iVar20].hd].fast,
                                        (stbi__huffman *)psVar30->huff_ac[paVar1[iVar20].ha].fast,
                                        psVar30->fast_ac[paVar1[iVar20].ha],iVar20,
                                        psVar30->dequant[paVar1[iVar20].tq]);
                    if (iVar46 == 0) {
                      bVar65 = false;
                      goto LAB_0012e9c1;
                    }
                    (*psVar30->idct_block_kernel)
                              (paVar1[iVar20].data + lVar32 + local_8974 * paVar1[iVar20].w2,
                               paVar1[iVar20].w2,data);
                    iVar46 = psVar30->todo;
                    psVar30->todo = iVar46 + -1;
                    if (iVar46 < 2) {
                      if (psVar30->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar30);
                      }
                      if ((psVar30->marker & 0xf8) != 0xd0) goto LAB_0012e9be;
                      stbi__jpeg_reset(psVar30);
                    }
                  }
                  local_8974 = local_8974 + 8;
                }
              }
              else {
                for (iVar20 = 0; iVar20 < psVar30->img_mcu_y; iVar20 = iVar20 + 1) {
                  for (iVar53 = 0; iVar53 < psVar30->img_mcu_x; iVar53 = iVar53 + 1) {
                    for (lVar32 = 0; lVar32 < psVar30->scan_n; lVar32 = lVar32 + 1) {
                      iVar51 = psVar30->order[lVar32];
                      for (iVar46 = 0; iVar46 < paVar1[iVar51].v; iVar46 = iVar46 + 1) {
                        for (iVar47 = 0; iVar22 = paVar1[iVar51].h, iVar47 < iVar22;
                            iVar47 = iVar47 + 1) {
                          iVar23 = paVar1[iVar51].v;
                          iVar24 = stbi__jpeg_decode_block
                                             (psVar30,data,
                                              (stbi__huffman *)
                                              psVar30->huff_dc[paVar1[iVar51].hd].fast,
                                              (stbi__huffman *)
                                              psVar30->huff_ac[paVar1[iVar51].ha].fast,
                                              psVar30->fast_ac[paVar1[iVar51].ha],iVar51,
                                              psVar30->dequant[paVar1[iVar51].tq]);
                          if (iVar24 == 0) {
                            bVar65 = false;
                            goto LAB_0012e9c1;
                          }
                          (*psVar30->idct_block_kernel)
                                    (paVar1[iVar51].data +
                                     (long)((iVar22 * iVar53 + iVar47) * 8) +
                                     (long)((iVar23 * iVar20 + iVar46) * paVar1[iVar51].w2 * 8),
                                     paVar1[iVar51].w2,data);
                        }
                      }
                    }
                    iVar51 = psVar30->todo;
                    psVar30->todo = iVar51 + -1;
                    if (iVar51 < 2) {
                      if (psVar30->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar30);
                      }
                      if ((psVar30->marker & 0xf8) != 0xd0) goto LAB_0012e9be;
                      stbi__jpeg_reset(psVar30);
                    }
                  }
                }
              }
LAB_0012e9be:
              bVar65 = true;
LAB_0012e9c1:
              if (!bVar65) goto LAB_0012f5c9;
            }
            else if (psVar30->scan_n == 1) {
              iVar20 = psVar30->order[0];
              iVar53 = psVar30->img_comp[iVar20].x + 7 >> 3;
              iVar51 = psVar30->img_comp[iVar20].y + 7 >> 3;
              iVar46 = 0;
              if (iVar53 < 1) {
                iVar53 = iVar46;
              }
              if (iVar51 < 1) {
                iVar51 = iVar46;
              }
              for (; iVar46 != iVar51; iVar46 = iVar46 + 1) {
                for (iVar47 = 0; iVar47 != iVar53; iVar47 = iVar47 + 1) {
                  psVar63 = paVar1[iVar20].coeff + (paVar1[iVar20].coeff_w * iVar46 + iVar47) * 0x40
                  ;
                  uVar56 = (ulong)psVar30->spec_start;
                  if (uVar56 == 0) {
                    iVar22 = stbi__jpeg_decode_block_prog_dc
                                       (psVar30,psVar63,
                                        (stbi__huffman *)psVar30->huff_dc[paVar1[iVar20].hd].fast,
                                        iVar20);
                    if (iVar22 == 0) goto LAB_0012f5c9;
                  }
                  else {
                    iVar22 = paVar1[iVar20].ha;
                    psVar38 = psVar30->huff_ac[iVar22].fast;
                    iVar23 = psVar30->eob_run;
                    bVar13 = (byte)psVar30->succ_low;
                    if (psVar30->succ_high == 0) {
                      if (iVar23 == 0) {
                        do {
                          if (psVar30->code_bits < 0x10) {
                            stbi__grow_buffer_unsafe(psVar30);
                          }
                          sVar42 = psVar30->fast_ac[iVar22][psVar30->code_buffer >> 0x17];
                          uVar61 = (uint)sVar42;
                          iVar23 = (int)uVar56;
                          if (sVar42 == 0) {
                            uVar61 = stbi__jpeg_huff_decode(psVar30,(stbi__huffman *)psVar38);
                            if ((int)uVar61 < 0) goto LAB_0012ef73;
                            uVar52 = uVar61 >> 4;
                            if ((uVar61 & 0xf) == 0) {
                              if (uVar61 < 0xf0) {
                                iVar23 = 1 << ((byte)uVar52 & 0x1f);
                                psVar30->eob_run = iVar23;
                                if (0xf < uVar61) {
                                  iVar23 = stbi__jpeg_get_bits(psVar30,uVar52);
                                  iVar23 = iVar23 + psVar30->eob_run;
                                }
                                goto LAB_0012e2ce;
                              }
                              uVar56 = (ulong)(iVar23 + 0x10);
                            }
                            else {
                              lVar32 = (ulong)uVar52 + (long)iVar23;
                              uVar56 = (ulong)((int)lVar32 + 1);
                              bVar14 = ""[lVar32];
                              iVar23 = stbi__extend_receive(psVar30,uVar61 & 0xf);
                              psVar63[bVar14] = (short)(iVar23 << (bVar13 & 0x1f));
                            }
                          }
                          else {
                            lVar32 = (ulong)(uVar61 >> 4 & 0xf) + (long)iVar23;
                            psVar30->code_buffer = psVar30->code_buffer << (sbyte)(uVar61 & 0xf);
                            psVar30->code_bits = psVar30->code_bits - (uVar61 & 0xf);
                            uVar56 = (ulong)((int)lVar32 + 1);
                            psVar63[""[lVar32]] = (short)((uVar61 >> 8) << (bVar13 & 0x1f));
                          }
                        } while ((int)uVar56 <= psVar30->spec_end);
                      }
                      else {
LAB_0012e2ce:
                        psVar30->eob_run = iVar23 + -1;
                      }
                    }
                    else if (iVar23 == 0) {
                      iVar22 = 0x10000 << (bVar13 & 0x1f);
                      do {
                        uVar61 = stbi__jpeg_huff_decode(psVar30,(stbi__huffman *)psVar38);
                        if ((int)uVar61 < 0) goto LAB_0012ef73;
                        uVar52 = uVar61 >> 4;
                        if ((uVar61 & 0xf) == 1) {
                          iVar23 = stbi__jpeg_get_bit(psVar30);
                          iVar24 = 1;
                          if (iVar23 == 0) {
                            iVar24 = 0xffff;
                          }
                          sVar42 = (short)(iVar24 << (bVar13 & 0x1f));
                        }
                        else {
                          if ((uVar61 & 0xf) != 0) {
                            pcVar31 = "bad huffman code";
                            goto LAB_0012f5c0;
                          }
                          if (uVar61 < 0xf0) {
                            psVar30->eob_run = ~(-1 << ((byte)uVar52 & 0x1f));
                            if (0xf < uVar61) {
                              iVar23 = stbi__jpeg_get_bits(psVar30,uVar52);
                              psVar30->eob_run = psVar30->eob_run + iVar23;
                            }
                            uVar52 = 0x40;
                          }
                          else {
                            uVar52 = 0xf;
                          }
                          sVar42 = 0;
                        }
                        uVar48 = (long)(int)uVar56;
                        do {
                          while( true ) {
                            uVar56 = uVar48;
                            iVar23 = psVar30->spec_end;
                            if ((long)iVar23 < (long)uVar56) goto LAB_0012e3fd;
                            bVar14 = ""[uVar56];
                            if (psVar63[bVar14] == 0) break;
                            iVar23 = stbi__jpeg_get_bit(psVar30);
                            if ((iVar23 != 0) &&
                               (sVar6 = psVar63[bVar14], (iVar22 >> 0x10 & (int)sVar6) == 0)) {
                              sVar11 = (short)((uint)iVar22 >> 0x10);
                              if (sVar6 < 1) {
                                sVar11 = -sVar11;
                              }
                              psVar63[bVar14] = sVar6 + sVar11;
                            }
                            uVar48 = uVar56 + 1;
                          }
                          bVar65 = uVar52 != 0;
                          uVar52 = uVar52 - 1;
                          uVar48 = uVar56 + 1;
                        } while (bVar65);
                        psVar63[bVar14] = sVar42;
                        uVar56 = uVar56 + 1;
LAB_0012e3fd:
                      } while ((int)uVar56 <= iVar23);
                    }
                    else {
                      psVar30->eob_run = iVar23 + -1;
                      uVar61 = (0x10000 << (bVar13 & 0x1f)) >> 0x10;
                      for (; (long)uVar56 <= (long)psVar30->spec_end; uVar56 = uVar56 + 1) {
                        bVar13 = ""[uVar56];
                        if (((psVar63[bVar13] != 0) &&
                            (iVar22 = stbi__jpeg_get_bit(psVar30), iVar22 != 0)) &&
                           (sVar42 = psVar63[bVar13], (uVar61 & (int)sVar42) == 0)) {
                          uVar52 = -uVar61;
                          if (0 < sVar42) {
                            uVar52 = uVar61;
                          }
                          psVar63[bVar13] = (short)uVar52 + sVar42;
                        }
                      }
                    }
                  }
                  iVar22 = psVar30->todo;
                  psVar30->todo = iVar22 + -1;
                  if (iVar22 < 2) {
                    if (psVar30->code_bits < 0x18) {
                      stbi__grow_buffer_unsafe(psVar30);
                    }
                    bVar13 = psVar30->marker;
                    if ((bVar13 & 0xf8) != 0xd0) goto LAB_0012e9d0;
                    stbi__jpeg_reset(psVar30);
                  }
                }
              }
            }
            else {
              for (iVar20 = 0; iVar20 < psVar30->img_mcu_y; iVar20 = iVar20 + 1) {
                for (iVar53 = 0; iVar53 < psVar30->img_mcu_x; iVar53 = iVar53 + 1) {
                  for (lVar32 = 0; lVar32 < psVar30->scan_n; lVar32 = lVar32 + 1) {
                    iVar51 = psVar30->order[lVar32];
                    for (iVar46 = 0; iVar46 < paVar1[iVar51].v; iVar46 = iVar46 + 1) {
                      iVar47 = 0;
                      while (iVar47 < paVar1[iVar51].h) {
                        iVar22 = stbi__jpeg_decode_block_prog_dc
                                           (psVar30,paVar1[iVar51].coeff +
                                                    (paVar1[iVar51].h * iVar53 + iVar47 +
                                                    (paVar1[iVar51].v * iVar20 + iVar46) *
                                                    paVar1[iVar51].coeff_w) * 0x40,
                                            (stbi__huffman *)
                                            psVar30->huff_dc[paVar1[iVar51].hd].fast,iVar51);
                        iVar47 = iVar47 + 1;
                        if (iVar22 == 0) goto LAB_0012f5c9;
                      }
                    }
                  }
                  iVar51 = psVar30->todo;
                  psVar30->todo = iVar51 + -1;
                  if (iVar51 < 2) {
                    if (psVar30->code_bits < 0x18) {
                      stbi__grow_buffer_unsafe(psVar30);
                    }
                    bVar13 = psVar30->marker;
                    if ((bVar13 & 0xf8) != 0xd0) goto LAB_0012e9d0;
                    stbi__jpeg_reset(psVar30);
                  }
                }
              }
            }
            bVar13 = psVar30->marker;
LAB_0012e9d0:
            if (bVar13 == 0xff) {
              do {
                iVar20 = stbi__at_eof(psVar30->s);
                if (iVar20 != 0) goto LAB_0012df83;
                sVar15 = stbi__get8(psVar30->s);
              } while (sVar15 != 0xff);
              sVar15 = stbi__get8(psVar30->s);
              psVar30->marker = sVar15;
            }
            goto LAB_0012df83;
          }
          pcVar31 = "bad SOS";
        }
        goto LAB_0012f5c0;
      }
LAB_0012f5c9:
      stbi__cleanup_jpeg(psVar30);
    }
    else {
      pcVar31 = "bad req_comp";
LAB_0012de3d:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar31;
    }
    data_01 = (stbi__context *)0x0;
    goto LAB_0012f5d8;
  }
  iVar20 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar20 != 0) {
    if ((uint)req_comp < 5) {
      data._0_8_ = s;
      iVar20 = stbi__parse_png_file((stbi__png *)data,0,req_comp);
      uVar8 = data._0_8_;
      if (iVar20 == 0) {
        data_01 = (stbi__context *)0x0;
      }
      else {
        if ((int)data._32_4_ < 9) {
          iVar20 = 8;
        }
        else {
          if (data._32_4_ != 0x10) {
            pcVar31 = "bad bits_per_channel";
            goto LAB_0012de92;
          }
          iVar20 = 0x10;
        }
        ri->bits_per_channel = iVar20;
        if ((req_comp != 0) && (iVar20 = *(int *)(data._0_8_ + 0xc), iVar20 != req_comp)) {
          if ((int)data._32_4_ < 9) {
            data._24_8_ = stbi__convert_format
                                    ((uchar *)data._24_8_,iVar20,req_comp,*(uint *)data._0_8_,
                                     *(uint *)(data._0_8_ + 4));
          }
          else {
            data._24_8_ = stbi__convert_format16
                                    ((stbi__uint16 *)data._24_8_,iVar20,req_comp,*(uint *)data._0_8_
                                     ,*(uint *)(data._0_8_ + 4));
          }
          *(int *)(uVar8 + 0xc) = req_comp;
          if ((stbi__context *)data._24_8_ == (stbi__context *)0x0) {
            return (void *)0x0;
          }
        }
        *x = *(int *)uVar8;
        *y = *(int *)(uVar8 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(uVar8 + 8);
        }
        data_01 = (stbi__context *)data._24_8_;
        data._24_8_ = (void *)0x0;
      }
      free((void *)data._24_8_);
      free((void *)data._16_8_);
      goto LAB_0012f5d8;
    }
    pcVar31 = "bad req_comp";
    goto LAB_0012de92;
  }
  sVar15 = stbi__get8(s);
  if ((sVar15 == 'B') && (sVar15 = stbi__get8(s), sVar15 == 'M')) {
    stbi__get32le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get32le(s);
    sVar21 = stbi__get32le(s);
    if (((0x38 < sVar21) || ((0x100010000001000U >> ((ulong)sVar21 & 0x3f) & 1) == 0)) &&
       ((sVar21 != 0x7c && (sVar21 != 0x6c)))) goto LAB_0012eb93;
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    coutput[3] = (stbi_uc *)CONCAT44(0xff,(uint)coutput[3]);
    pvVar35 = stbi__bmp_parse_header(s,(stbi__bmp_data *)coutput);
    if (pvVar35 == (void *)0x0) {
      return (void *)0x0;
    }
    sVar21 = s->img_y;
    uVar61 = -sVar21;
    if (0 < (int)sVar21) {
      uVar61 = sVar21;
    }
    s->img_y = uVar61;
    if ((0x1000000 < uVar61) || (uVar52 = s->img_x, 0x1000000 < uVar52)) goto LAB_00130bcc;
    uVar27 = (uint)coutput[3];
    local_8960 = coutput[3]._4_4_;
    if ((int)coutput[1] == 0xc) {
      if (0x17 < (int)coutput[0]) goto LAB_0012f70e;
      uVar28 = (int)((coutput[0]._4_4_ - local_88d8) + -0x18) / 3;
LAB_0012f6f8:
      if (uVar28 == 0) goto LAB_0012f70e;
      bVar65 = false;
LAB_0012f7db:
      bVar12 = (uint)coutput[3] == 0xff000000;
      iVar53 = 4 - (uint)((uint)coutput[3] == 0);
      iVar20 = (int)coutput[0];
    }
    else {
      if ((int)coutput[0] < 0x10) {
        uVar28 = (int)(coutput[0]._4_4_ - (local_88d8 + (int)coutput[1])) >> 2;
        goto LAB_0012f6f8;
      }
LAB_0012f70e:
      if (s->img_buffer + ((long)s->callback_already_read - (long)s) + -0x38 !=
          (stbi_uc *)(long)(int)coutput[0]._4_4_) {
        pcVar31 = "bad offset";
        goto LAB_0012de92;
      }
      uVar28 = 0;
      bVar65 = true;
      if ((int)coutput[0] != 0x18 || (uint)coutput[3] != 0xff000000) goto LAB_0012f7db;
      bVar12 = true;
      uVar28 = 0;
      iVar53 = 3;
      iVar20 = 0x18;
      bVar65 = true;
    }
    s->img_n = iVar53;
    if (2 < req_comp) {
      iVar53 = req_comp;
    }
    iVar51 = stbi__mad3sizes_valid(iVar53,uVar52,uVar61,0);
    if (iVar51 == 0) goto LAB_00130bcc;
    puVar34 = (uchar *)stbi__malloc_mad3(iVar53,uVar52,uVar61,0);
    if (puVar34 != (uchar *)0x0) {
      if (iVar20 < 0x10) {
        if (!bVar65 && (int)uVar28 < 0x101) {
          uVar48 = 0;
          uVar56 = 0;
          if (0 < (int)uVar28) {
            uVar56 = (ulong)uVar28;
          }
          for (; uVar56 != uVar48; uVar48 = uVar48 + 1) {
            sVar15 = stbi__get8(s);
            *(stbi_uc *)(data + uVar48 * 2 + 1) = sVar15;
            sVar15 = stbi__get8(s);
            *(stbi_uc *)((long)data + uVar48 * 4 + 1) = sVar15;
            sVar15 = stbi__get8(s);
            *(stbi_uc *)(data + uVar48 * 2) = sVar15;
            if ((int)coutput[1] != 0xc) {
              stbi__get8(s);
            }
            *(undefined1 *)((long)data + uVar48 * 4 + 3) = 0xff;
          }
          stbi__skip(s,(uVar28 * ((int)coutput[1] == 0xc | 0xfffffffc) + coutput[0]._4_4_) -
                       ((int)coutput[1] + local_88d8));
          if (iVar20 == 1) {
            sVar26 = s->img_x;
            iVar20 = 0;
            uVar61 = 0;
LAB_001307cc:
            uVar56 = (ulong)uVar61;
            sVar25 = s->img_y;
            if (iVar20 < (int)sVar25) {
              iVar51 = 0;
              do {
                bVar13 = stbi__get8(s);
                sVar25 = s->img_x;
                iVar46 = 8;
                do {
                  uVar61 = (uint)uVar56;
                  if ((int)sVar25 <= iVar51) {
LAB_00130867:
                    stbi__skip(s,-(sVar26 + 7 >> 3) & 3);
                    iVar20 = iVar20 + 1;
                    goto LAB_001307cc;
                  }
                  uVar48 = (ulong)((bVar13 >> (iVar46 - 1U & 0x1f) & 1) != 0);
                  lVar32 = (long)(int)uVar61;
                  uVar56 = lVar32 + 3;
                  puVar34[lVar32] = (uchar)data[uVar48 * 2];
                  puVar34[lVar32 + 1] = *(uchar *)((long)data + uVar48 * 4 + 1);
                  puVar34[lVar32 + 2] = (uchar)data[uVar48 * 2 + 1];
                  if (iVar53 == 4) {
                    puVar34[lVar32 + 3] = 0xff;
                    uVar56 = (ulong)(uVar61 + 4);
                  }
                  if (sVar25 - 1 == iVar51) {
                    uVar61 = (uint)uVar56;
                    goto LAB_00130867;
                  }
                  iVar51 = iVar51 + 1;
                  iVar47 = iVar46 + -1;
                  bVar65 = 0 < iVar46;
                  iVar46 = iVar47;
                } while (iVar47 != 0 && bVar65);
              } while( true );
            }
          }
          else {
            if (iVar20 == 8) {
              uVar61 = s->img_x;
            }
            else {
              if (iVar20 != 4) {
                free(puVar34);
                pcVar31 = "bad bpp";
                goto LAB_0012de92;
              }
              uVar61 = s->img_x + 1 >> 1;
            }
            uVar56 = 0;
            for (iVar51 = 0; sVar25 = s->img_y, iVar51 < (int)sVar25; iVar51 = iVar51 + 1) {
              for (iVar46 = 0; iVar46 < (int)s->img_x; iVar46 = iVar46 + 2) {
                bVar13 = stbi__get8(s);
                uVar52 = (uint)(bVar13 >> 4);
                if (iVar20 != 4) {
                  uVar52 = (uint)bVar13;
                }
                uVar48 = (ulong)uVar52;
                uVar52 = bVar13 & 0xf;
                if (iVar20 != 4) {
                  uVar52 = 0;
                }
                lVar32 = (long)(int)uVar56;
                uVar40 = lVar32 + 3;
                puVar34[lVar32] = (uchar)data[uVar48 * 2];
                puVar34[lVar32 + 1] = *(uchar *)((long)data + uVar48 * 4 + 1);
                puVar34[lVar32 + 2] = (uchar)data[uVar48 * 2 + 1];
                if (iVar53 == 4) {
                  puVar34[lVar32 + 3] = 0xff;
                  uVar40 = (ulong)((int)uVar56 + 4);
                }
                if (iVar46 + 1U == s->img_x) {
                  uVar56 = uVar40 & 0xffffffff;
                  break;
                }
                if (iVar20 == 8) {
                  bVar13 = stbi__get8(s);
                  uVar52 = (uint)bVar13;
                }
                lVar32 = (long)(int)uVar40;
                uVar56 = lVar32 + 3;
                uVar48 = (ulong)uVar52;
                puVar34[lVar32] = (uchar)data[uVar48 * 2];
                puVar34[lVar32 + 1] = *(uchar *)((long)data + uVar48 * 4 + 1);
                puVar34[lVar32 + 2] = (uchar)data[uVar48 * 2 + 1];
                if (iVar53 == 4) {
                  puVar34[lVar32 + 3] = 0xff;
                  uVar56 = (ulong)((int)uVar40 + 4);
                }
              }
              stbi__skip(s,-uVar61 & 3);
            }
          }
          goto LAB_001309b8;
        }
        free(puVar34);
        pcVar31 = "invalid";
        goto LAB_0012de92;
      }
      stbi__skip(s,coutput[0]._4_4_ - ((int)coutput[1] + local_88d8));
      if (iVar20 != 0x10) {
        if (iVar20 == 0x20) {
          local_8900 = 0;
          if ((bool)(bVar12 & (coutput[1]._4_4_ == 0xff0000 &&
                              ((uint)coutput[2] == 0xff00 && coutput[2]._4_4_ == 0xff)))) {
            bVar65 = true;
            goto LAB_00130357;
          }
          goto LAB_001303a4;
        }
        local_8900 = 0;
        if (iVar20 != 0x18) goto LAB_001303a4;
        local_8900 = s->img_x & 3;
        bVar65 = false;
LAB_00130357:
        bVar12 = false;
        iVar47 = 0;
        iVar51 = 0;
        iVar46 = 0;
        local_88fc = 0;
        uVar61 = 0;
        uVar52 = 0;
        local_8904 = 0;
        local_88b4 = 0;
LAB_0013060b:
        iVar23 = 0;
        for (iVar22 = 0; sVar25 = s->img_y, iVar22 < (int)sVar25; iVar22 = iVar22 + 1) {
          if (bVar12) {
            for (iVar24 = 0; iVar24 < (int)s->img_x; iVar24 = iVar24 + 1) {
              if (iVar20 == 0x10) {
                uVar28 = stbi__get16le(s);
              }
              else {
                uVar28 = stbi__get32le(s);
              }
              iVar29 = stbi__shiftsigned(uVar28 & coutput[1]._4_4_,iVar47,uVar61);
              puVar34[iVar23] = (uchar)iVar29;
              iVar29 = stbi__shiftsigned(uVar28 & (uint)coutput[2],iVar51,uVar52);
              puVar34[(long)iVar23 + 1] = (uchar)iVar29;
              iVar29 = stbi__shiftsigned(uVar28 & coutput[2]._4_4_,iVar46,local_8904);
              puVar34[(long)iVar23 + 2] = (uchar)iVar29;
              if (uVar27 == 0) {
                uVar28 = 0xff;
              }
              else {
                uVar28 = stbi__shiftsigned(uVar28 & uVar27,local_88fc,local_88b4);
              }
              iVar29 = iVar23 + 3;
              if (iVar53 == 4) {
                puVar34[(long)iVar23 + 3] = (uchar)uVar28;
                iVar29 = iVar23 + 4;
              }
              iVar23 = iVar29;
              local_8960 = local_8960 | uVar28;
            }
          }
          else {
            for (iVar24 = 0; iVar24 < (int)s->img_x; iVar24 = iVar24 + 1) {
              sVar15 = stbi__get8(s);
              puVar34[(long)iVar23 + 2] = sVar15;
              sVar15 = stbi__get8(s);
              puVar34[(long)iVar23 + 1] = sVar15;
              sVar15 = stbi__get8(s);
              puVar34[iVar23] = sVar15;
              bVar13 = 0xff;
              if (bVar65) {
                bVar13 = stbi__get8(s);
              }
              iVar29 = iVar23 + 3;
              if (iVar53 == 4) {
                puVar34[(long)iVar23 + 3] = bVar13;
                iVar29 = iVar23 + 4;
              }
              iVar23 = iVar29;
              local_8960 = local_8960 | bVar13;
            }
          }
          stbi__skip(s,local_8900);
        }
LAB_001309b8:
        if ((iVar53 == 4) && (local_8960 == 0)) {
          for (uVar61 = s->img_x * sVar25 * 4 - 1; -1 < (int)uVar61; uVar61 = uVar61 - 4) {
            puVar34[uVar61] = 0xff;
          }
        }
        if (0 < (int)sVar21) {
          iVar20 = (int)sVar25 >> 1;
          if ((int)sVar25 >> 1 < 1) {
            iVar20 = 0;
          }
          iVar47 = (sVar25 - 1) * iVar53;
          iVar51 = 0;
          for (iVar46 = 0; iVar46 != iVar20; iVar46 = iVar46 + 1) {
            sVar21 = s->img_x;
            uVar56 = (ulong)(sVar21 * iVar53);
            if ((int)(sVar21 * iVar53) < 1) {
              uVar56 = 0;
            }
            for (uVar48 = 0; uVar56 != uVar48; uVar48 = uVar48 + 1) {
              uVar4 = puVar34[uVar48 + sVar21 * iVar51];
              puVar34[uVar48 + sVar21 * iVar51] = puVar34[uVar48 + sVar21 * iVar47];
              puVar34[uVar48 + sVar21 * iVar47] = uVar4;
            }
            iVar47 = iVar47 - iVar53;
            iVar51 = iVar51 + iVar53;
          }
        }
        uVar61 = s->img_x;
        if ((req_comp != 0) && (iVar53 != req_comp)) {
          puVar34 = stbi__convert_format(puVar34,iVar53,req_comp,uVar61,sVar25);
          if (puVar34 == (uchar *)0x0) {
            return (void *)0x0;
          }
          uVar61 = s->img_x;
        }
        *x = uVar61;
        *y = s->img_y;
        if (comp == (int *)0x0) {
          return puVar34;
        }
        *comp = s->img_n;
        return puVar34;
      }
      local_8900 = s->img_x * 2 & 2;
LAB_001303a4:
      if (((uint)coutput[2] != 0 && coutput[1]._4_4_ != 0) && coutput[2]._4_4_ != 0) {
        iVar47 = stbi__high_bit(coutput[1]._4_4_);
        uVar61 = stbi__bitcount(coutput[1]._4_4_);
        iVar51 = stbi__high_bit((uint)coutput[2]);
        uVar52 = stbi__bitcount((uint)coutput[2]);
        iVar46 = stbi__high_bit(coutput[2]._4_4_);
        local_8904 = stbi__bitcount(coutput[2]._4_4_);
        local_88fc = stbi__high_bit(uVar27);
        local_88b4 = stbi__bitcount(uVar27);
        if ((local_88b4 < 9 && local_8904 < 9) && (uVar52 < 9 && uVar61 < 9)) {
          iVar47 = iVar47 + -7;
          iVar51 = iVar51 + -7;
          iVar46 = iVar46 + -7;
          local_88fc = local_88fc + -7;
          bVar12 = true;
          bVar65 = false;
          goto LAB_0013060b;
        }
      }
      free(puVar34);
      pcVar31 = "bad masks";
      goto LAB_0012de92;
    }
LAB_0012f91b:
    pcVar31 = "outofmem";
    goto LAB_0012de92;
  }
LAB_0012eb93:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar20 = stbi__gif_test(s);
  if (iVar20 != 0) {
    memset((stbi__gif *)data,0,0x8870);
    data_01 = (stbi__context *)stbi__gif_load_next(s,(stbi__gif *)data,comp,0,psVar38);
    if (data_01 == (stbi__context *)0x0 || data_01 == s) {
      free((void *)data._8_8_);
      data_01 = (stbi__context *)0x0;
    }
    else {
      *x = data._0_4_;
      *y = data._4_4_;
      if ((req_comp & 0xfffffffbU) != 0) {
        data_01 = (stbi__context *)
                  stbi__convert_format((uchar *)data_01,4,req_comp,data._0_4_,data._4_4_);
      }
    }
    free((void *)data._24_8_);
    data._8_8_ = data._16_8_;
LAB_0012f5d8:
    free((void *)data._8_8_);
    return data_01;
  }
  sVar21 = stbi__get32be(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar21 == 0x38425053) {
    sVar21 = stbi__get32be(s);
    if (sVar21 != 0x38425053) {
      pcVar31 = "not PSD";
      goto LAB_0012de92;
    }
    iVar20 = stbi__get16be(s);
    if (iVar20 != 1) {
      pcVar31 = "wrong version";
      goto LAB_0012de92;
    }
    stbi__skip(s,6);
    uVar61 = stbi__get16be(s);
    if (0x10 < uVar61) {
      pcVar31 = "wrong channel count";
      goto LAB_0012de92;
    }
    sVar21 = stbi__get32be(s);
    sVar25 = stbi__get32be(s);
    if (((int)sVar21 < 0x1000001) && ((int)sVar25 < 0x1000001)) {
      uVar52 = stbi__get16be(s);
      if (((short)uVar52 != 8) && ((uVar52 & 0xffff) != 0x10)) {
        pcVar31 = "unsupported bit depth";
        goto LAB_0012de92;
      }
      iVar20 = stbi__get16be(s);
      if (iVar20 != 3) {
        pcVar31 = "wrong color format";
        goto LAB_0012de92;
      }
      sVar26 = stbi__get32be(s);
      stbi__skip(s,sVar26);
      sVar26 = stbi__get32be(s);
      stbi__skip(s,sVar26);
      sVar26 = stbi__get32be(s);
      stbi__skip(s,sVar26);
      uVar27 = stbi__get16be(s);
      if (1 < uVar27) {
        pcVar31 = "bad compression";
        goto LAB_0012de92;
      }
      iVar20 = stbi__mad3sizes_valid(4,sVar25,sVar21,0);
      if (iVar20 != 0) {
        if (((bpc == 0x10) && (uVar52 == 0x10)) && (uVar27 == 0)) {
          local_8968 = (stbi__uint16 *)stbi__malloc_mad3(8,sVar25,sVar21,0);
          ri->bits_per_channel = 0x10;
        }
        else {
          local_8968 = (stbi__uint16 *)malloc((long)(int)(sVar21 * sVar25 * 4));
        }
        if (local_8968 != (stbi__uint16 *)0x0) {
          uVar28 = sVar25 * sVar21;
          if (uVar27 == 0) {
            uVar56 = 0;
            psVar44 = local_8968;
            psVar64 = local_8968;
            uVar27 = 0;
            if (0 < (int)uVar28) {
              uVar27 = uVar28;
            }
            for (; uVar56 != 4; uVar56 = uVar56 + 1) {
              if (uVar56 < uVar61) {
                if (ri->bits_per_channel == 0x10) {
                  for (lVar32 = 0; uVar27 != (uint)lVar32; lVar32 = lVar32 + 1) {
                    iVar20 = stbi__get16be(s);
                    psVar64[lVar32 * 4] = (stbi__uint16)iVar20;
                  }
                }
                else {
                  lVar32 = 0;
                  if (uVar52 == 0x10) {
                    for (; uVar27 != (uint)lVar32; lVar32 = lVar32 + 1) {
                      iVar20 = stbi__get16be(s);
                      *(char *)(psVar44 + lVar32 * 2) = (char)((uint)iVar20 >> 8);
                    }
                  }
                  else {
                    for (; uVar27 != (uint)lVar32; lVar32 = lVar32 + 1) {
                      sVar15 = stbi__get8(s);
                      *(stbi_uc *)(psVar44 + lVar32 * 2) = sVar15;
                    }
                  }
                }
              }
              else if (uVar52 == 0x10 && bpc == 0x10) {
                for (lVar32 = 0; uVar27 != (uint)lVar32; lVar32 = lVar32 + 1) {
                  psVar64[lVar32 * 4] = -(ushort)(uVar56 == 3);
                }
              }
              else {
                for (lVar32 = 0; uVar27 != (uint)lVar32; lVar32 = lVar32 + 1) {
                  *(char *)(psVar44 + lVar32 * 2) = -(uVar56 == 3);
                }
              }
              psVar44 = (stbi__uint16 *)((long)psVar44 + 1);
              psVar64 = psVar64 + 1;
            }
          }
          else {
            stbi__skip(s,sVar21 * uVar61 * 2);
            uVar56 = 0;
            psVar44 = local_8968;
            uVar52 = 0;
            if (0 < (int)uVar28) {
              uVar52 = uVar28;
            }
            for (; uVar56 != 4; uVar56 = uVar56 + 1) {
              if (uVar56 < uVar61) {
                psVar38 = (stbi_uc *)((long)local_8968 + uVar56);
                iVar20 = 0;
                do {
                  uVar27 = uVar28 - iVar20;
                  do {
                    if ((int)uVar27 < 1) goto LAB_00130d36;
                    bVar13 = stbi__get8(s);
                  } while (bVar13 == 0x80);
                  uVar54 = (uint)bVar13;
                  if ((char)bVar13 < '\0') {
                    uVar62 = 0x101 - uVar54;
                    if (uVar27 < uVar62) goto LAB_001310ad;
                    sVar15 = stbi__get8(s);
                    for (iVar53 = uVar54 - 0x101; iVar53 != 0; iVar53 = iVar53 + 1) {
                      *psVar38 = sVar15;
                      psVar38 = psVar38 + 4;
                    }
                  }
                  else {
                    if (uVar27 <= bVar13) {
LAB_001310ad:
                      free(local_8968);
                      pcVar31 = "corrupt";
                      goto LAB_0012de92;
                    }
                    uVar62 = uVar54 + 1;
                    uVar27 = uVar62;
                    while (bVar65 = uVar27 != 0, uVar27 = uVar27 - 1, bVar65) {
                      sVar15 = stbi__get8(s);
                      *psVar38 = sVar15;
                      psVar38 = psVar38 + 4;
                    }
                  }
                  iVar20 = iVar20 + uVar62;
                } while( true );
              }
              for (lVar32 = 0; uVar52 != (uint)lVar32; lVar32 = lVar32 + 1) {
                *(char *)(psVar44 + lVar32 * 2) = -(uVar56 == 3);
              }
LAB_00130d36:
              psVar44 = (stbi__uint16 *)((long)psVar44 + 1);
            }
          }
          if (3 < uVar61) {
            uVar56 = 0;
            if (0 < (int)uVar28) {
              uVar56 = (ulong)uVar28;
            }
            if (ri->bits_per_channel == 0x10) {
              for (uVar48 = 0; uVar56 != uVar48; uVar48 = uVar48 + 1) {
                uVar7 = local_8968[uVar48 * 4 + 3];
                if ((uVar7 != 0) && (uVar7 != 0xffff)) {
                  fVar67 = 1.0 / ((float)uVar7 / 65535.0);
                  fVar66 = (1.0 - fVar67) * 65535.0;
                  auVar68._0_4_ =
                       (int)(fVar66 + fVar67 * (float)(*(uint *)(local_8968 + uVar48 * 4) & 0xffff))
                  ;
                  auVar68._4_4_ =
                       (int)(fVar66 + fVar67 * (float)(*(uint *)(local_8968 + uVar48 * 4) >> 0x10));
                  auVar68._8_4_ = (int)(fVar66 + fVar67 * 0.0);
                  auVar68._12_4_ = (int)(fVar66 + fVar67 * 0.0);
                  auVar68 = pshuflw(auVar68,auVar68,0xe8);
                  *(int *)(local_8968 + uVar48 * 4) = auVar68._0_4_;
                  local_8968[uVar48 * 4 + 2] =
                       (stbi__uint16)(int)((float)local_8968[uVar48 * 4 + 2] * fVar67 + fVar66);
                }
              }
            }
            else {
              for (uVar48 = 0; uVar56 != uVar48; uVar48 = uVar48 + 1) {
                bVar13 = *(byte *)((long)local_8968 + uVar48 * 4 + 3);
                if ((bVar13 != 0) && (bVar13 != 0xff)) {
                  fVar67 = 1.0 / ((float)bVar13 / 255.0);
                  fVar66 = (1.0 - fVar67) * 255.0;
                  *(char *)(local_8968 + uVar48 * 2) =
                       (char)(int)((float)(byte)local_8968[uVar48 * 2] * fVar67 + fVar66);
                  *(char *)((long)local_8968 + uVar48 * 4 + 1) =
                       (char)(int)((float)*(byte *)((long)local_8968 + uVar48 * 4 + 1) * fVar67 +
                                  fVar66);
                  *(char *)(local_8968 + uVar48 * 2 + 1) =
                       (char)(int)((float)(byte)local_8968[uVar48 * 2 + 1] * fVar67 + fVar66);
                }
              }
            }
          }
          if ((req_comp & 0xfffffffbU) != 0) {
            if (ri->bits_per_channel == 0x10) {
              local_8968 = stbi__convert_format16(local_8968,4,req_comp,sVar25,sVar21);
            }
            else {
              local_8968 = (stbi__uint16 *)
                           stbi__convert_format((uchar *)local_8968,4,req_comp,sVar25,sVar21);
            }
            if (local_8968 == (stbi__uint16 *)0x0) {
              return (void *)0x0;
            }
          }
          if (comp != (int *)0x0) {
            *comp = 4;
          }
          *y = sVar21;
          *x = sVar25;
          return local_8968;
        }
        goto LAB_0012f91b;
      }
    }
  }
  else {
    iVar20 = stbi__pic_is4(s,anon_var_dwarf_2aa34);
    if (iVar20 == 0) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
    }
    else {
      iVar20 = 0x54;
      while (bVar65 = iVar20 != 0, iVar20 = iVar20 + -1, bVar65) {
        stbi__get8(s);
      }
      iVar20 = stbi__pic_is4(s,"PICT");
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (iVar20 != 0) {
        iVar20 = 0x5c;
        while (bVar65 = iVar20 != 0, iVar20 = iVar20 + -1, bVar65) {
          stbi__get8(s);
        }
        uVar61 = stbi__get16be(s);
        uVar52 = stbi__get16be(s);
        iVar20 = stbi__at_eof(s);
        if (iVar20 != 0) {
          pcVar31 = "bad file";
          goto LAB_0012de92;
        }
        bVar13 = 0;
        iVar20 = stbi__mad3sizes_valid(uVar61,uVar52,4,0);
        if (iVar20 != 0) {
          stbi__get32be(s);
          stbi__get16be(s);
          stbi__get16be(s);
          data_00 = (float *)stbi__malloc_mad3(uVar61,uVar52,4,0);
          uVar27 = uVar61 * 4;
          memset(data_00,0xff,(ulong)(uVar27 * uVar52));
          pbVar59 = (byte *)(data + 1);
          lVar32 = 0;
          psVar45 = (stbi__context *)(ulong)uVar27;
          do {
            if (lVar32 == 10) {
LAB_0012f907:
              s = psVar45;
              pcVar31 = "bad format";
LAB_00130219:
              iVar20 = (int)s;
              *(char **)(in_FS_OFFSET + -0x10) = pcVar31;
              goto LAB_001310e1;
            }
            sVar15 = stbi__get8(s);
            bVar14 = stbi__get8(s);
            pbVar59[-2] = bVar14;
            bVar17 = stbi__get8(s);
            pbVar59[-1] = bVar17;
            bVar17 = stbi__get8(s);
            *pbVar59 = bVar17;
            iVar20 = stbi__at_eof(s);
            if (iVar20 != 0) {
              pcVar31 = "bad file";
              goto LAB_00130219;
            }
            psVar45 = s;
            if (bVar14 != 8) goto LAB_0012f907;
            bVar13 = bVar13 | bVar17;
            pbVar59 = pbVar59 + 3;
            lVar32 = lVar32 + 1;
          } while (sVar15 != '\0');
          iVar20 = 4 - (uint)((bVar13 & 0x10) == 0);
          if (comp != (int *)0x0) {
            *comp = iVar20;
          }
          for (uVar56 = 0; uVar56 != uVar52; uVar56 = uVar56 + 1) {
            psVar38 = (stbi_uc *)((long)data_00 + (long)(int)(uVar27 * (int)uVar56));
            for (lVar49 = 0; lVar32 != lVar49; lVar49 = lVar49 + 1) {
              lVar10 = lVar49 * 3;
              cVar3 = *(char *)((long)data + lVar10 + 1);
              psVar57 = psVar38;
              uVar28 = uVar61;
              if (cVar3 == '\0') {
                while (bVar65 = uVar28 != 0, uVar28 = uVar28 - 1, bVar65) {
                  psVar33 = stbi__readval(s,(uint)*(byte *)((long)data + lVar10 + 2),psVar57);
                  if (psVar33 == (stbi_uc *)0x0) goto LAB_001310e1;
                  psVar57 = psVar57 + 4;
                }
              }
              else if (cVar3 == '\x01') {
                for (; 0 < (int)uVar28; uVar28 = uVar28 - (uVar54 & 0xff)) {
                  bVar13 = stbi__get8(s);
                  iVar53 = stbi__at_eof(s);
                  if (iVar53 != 0) goto LAB_00130798;
                  psVar33 = stbi__readval(s,(uint)*(byte *)((long)data + lVar10 + 2),
                                          (stbi_uc *)coutput);
                  if (psVar33 == (stbi_uc *)0x0) goto LAB_001310e1;
                  uVar54 = (uint)bVar13;
                  if (uVar28 < bVar13) {
                    uVar54 = uVar28;
                  }
                  uVar62 = uVar54 & 0xff;
                  while (bVar65 = uVar62 != 0, uVar62 = uVar62 - 1, bVar65) {
                    stbi__copyval((uint)*(byte *)((long)data + lVar10 + 2),psVar57,
                                  (stbi_uc *)coutput);
                    psVar57 = psVar57 + 4;
                  }
                }
              }
              else {
                if (cVar3 != '\x02') {
                  pcVar31 = "bad format";
LAB_001310ca:
                  *(char **)(in_FS_OFFSET + -0x10) = pcVar31;
                  goto LAB_001310e1;
                }
                for (; 0 < (int)uVar28; uVar28 = uVar28 - iVar53) {
                  bVar13 = stbi__get8(s);
                  iVar53 = stbi__at_eof(s);
                  if (iVar53 != 0) goto LAB_00130798;
                  uVar54 = (uint)bVar13;
                  if ((char)bVar13 < '\0') {
                    if (uVar54 == 0x80) {
                      iVar53 = stbi__get16be(s);
                    }
                    else {
                      iVar53 = uVar54 - 0x7f;
                    }
                    if ((int)uVar28 < iVar53) goto LAB_00130d41;
                    psVar33 = stbi__readval(s,(uint)*(byte *)((long)data + lVar10 + 2),
                                            (stbi_uc *)coutput);
                    iVar51 = iVar53;
                    if (psVar33 == (stbi_uc *)0x0) goto LAB_001310e1;
                    while (iVar51 != 0) {
                      stbi__copyval((uint)*(byte *)((long)data + lVar10 + 2),psVar57,
                                    (stbi_uc *)coutput);
                      psVar57 = psVar57 + 4;
                      iVar51 = iVar51 + -1;
                    }
                  }
                  else {
                    iVar53 = bVar13 + 1;
                    iVar51 = iVar53;
                    if (uVar28 <= uVar54) {
LAB_00130d41:
                      pcVar31 = "bad file";
                      goto LAB_001310ca;
                    }
                    while (bVar65 = iVar51 != 0, iVar51 = iVar51 + -1, bVar65) {
                      psVar33 = stbi__readval(s,(uint)*(byte *)((long)data + lVar10 + 2),psVar57);
                      if (psVar33 == (stbi_uc *)0x0) goto LAB_001310e1;
                      psVar57 = psVar57 + 4;
                    }
                  }
                }
              }
            }
          }
          if (data_00 == (float *)0x0) {
LAB_001310e1:
            free(data_00);
            data_00 = (float *)0x0;
          }
          *x = uVar61;
          *y = uVar52;
          bVar65 = req_comp != 0;
          if (bVar65) {
            iVar20 = req_comp;
          }
          req_comp = iVar20;
          if (!bVar65 && comp != (int *)0x0) {
            req_comp = *comp;
          }
          uVar27 = 4;
          goto LAB_00131121;
        }
        goto LAB_00130bcc;
      }
    }
    sVar15 = stbi__get8(s);
    sVar16 = stbi__get8(s);
    if ((sVar15 != 'P') || ((byte)(sVar16 - 0x37) < 0xfe)) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      iVar20 = stbi__hdr_test(s);
      if (iVar20 != 0) {
        data_00 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        if (data_00 == (float *)0x0) {
          return (void *)0x0;
        }
        iVar20 = *x;
        iVar53 = *y;
        uVar56 = 0;
        pvVar35 = stbi__malloc_mad3(iVar20,iVar53,req_comp,0);
        if (pvVar35 != (void *)0x0) {
          uVar61 = (req_comp + (req_comp & 1U)) - 1;
          uVar52 = iVar53 * iVar20;
          uVar48 = (ulong)uVar61;
          if ((int)uVar61 < 1) {
            uVar48 = uVar56;
          }
          lVar32 = (long)req_comp;
          pfVar43 = data_00;
          pvVar58 = pvVar35;
          uVar40 = (ulong)uVar52;
          if ((int)uVar52 < 1) {
            uVar40 = uVar56;
          }
          for (; uVar56 != uVar40; uVar56 = uVar56 + 1) {
            for (uVar55 = 0; uVar48 != uVar55; uVar55 = uVar55 + 1) {
              dVar9 = pow((double)(pfVar43[uVar55] * stbi__h2l_scale_i),(double)stbi__h2l_gamma_i);
              fVar67 = (float)dVar9 * 255.0 + 0.5;
              fVar66 = 0.0;
              if (0.0 <= fVar67) {
                fVar66 = fVar67;
              }
              fVar67 = 255.0;
              if (fVar66 <= 255.0) {
                fVar67 = fVar66;
              }
              *(char *)((long)pvVar58 + uVar55) = (char)(int)fVar67;
            }
            if ((int)uVar48 < req_comp) {
              lVar49 = uVar56 * lVar32 + uVar48;
              fVar67 = data_00[lVar49] * 255.0 + 0.5;
              fVar66 = 0.0;
              if (0.0 <= fVar67) {
                fVar66 = fVar67;
              }
              fVar67 = 255.0;
              if (fVar66 <= 255.0) {
                fVar67 = fVar66;
              }
              *(char *)((long)pvVar35 + lVar49) = (char)(int)fVar67;
            }
            pfVar43 = pfVar43 + lVar32;
            pvVar58 = (void *)((long)pvVar58 + lVar32);
          }
          free(data_00);
          return pvVar35;
        }
LAB_0012f916:
        free(data_00);
        goto LAB_0012f91b;
      }
      stbi__get8(s);
      bVar13 = stbi__get8(s);
      if (bVar13 < 2) {
        bVar14 = stbi__get8(s);
        if (bVar13 == 1) {
          if ((bVar14 & 0xf7) == 1) {
            iVar20 = 4;
            stbi__skip(s,4);
            bVar14 = stbi__get8(s);
            if ((bVar14 < 0x21) && ((0x101018100U >> ((ulong)bVar14 & 0x3f) & 1) != 0))
            goto LAB_0012f935;
          }
          goto LAB_0012f6bf;
        }
        if ((bVar14 & 0xf6) != 2) goto LAB_0012f6bf;
        iVar20 = 9;
LAB_0012f935:
        stbi__skip(s,iVar20);
        iVar20 = stbi__get16le(s);
        if ((iVar20 == 0) || (iVar20 = stbi__get16le(s), iVar20 == 0)) goto LAB_0012f6bf;
        bVar14 = stbi__get8(s);
        if (bVar13 != 1) {
          if ((bVar14 < 0x21) && ((0x101018100U >> ((ulong)bVar14 & 0x3f) & 1) != 0)) {
            s->img_buffer = s->img_buffer_original;
            s->img_buffer_end = s->img_buffer_original_end;
            goto LAB_00130519;
          }
          goto LAB_0012f6bf;
        }
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        if ((bVar14 - 8 & 0xf7) == 0) {
LAB_00130519:
          bVar14 = stbi__get8(s);
          sVar15 = stbi__get8(s);
          bVar17 = stbi__get8(s);
          iVar20 = stbi__get16le(s);
          uVar28 = stbi__get16le(s);
          bVar13 = stbi__get8(s);
          stbi__get16le(s);
          stbi__get16le(s);
          uVar61 = stbi__get16le(s);
          uVar52 = stbi__get16le(s);
          bVar18 = stbi__get8(s);
          data._0_8_ = (ulong)(uint)data._4_4_ << 0x20;
          bVar19 = stbi__get8(s);
          coutput[0] = (stbi_uc *)((ulong)coutput[0]._4_4_ << 0x20);
          if (sVar15 == '\0') {
            uVar27 = bVar17 - 8;
            if (bVar17 < 8) {
              uVar27 = (uint)bVar17;
            }
            uVar27 = (uint)(uVar27 == 3);
            bVar13 = bVar18;
          }
          else {
            uVar27 = 0;
          }
          uVar27 = stbi__tga_get_comp((uint)bVar13,uVar27,(int *)data);
          if (uVar27 == 0) {
            pcVar31 = "bad format";
            goto LAB_0012de92;
          }
          *x = uVar61;
          *y = uVar52;
          if (comp != (int *)0x0) {
            *comp = uVar27;
          }
          iVar53 = stbi__mad3sizes_valid(uVar61,uVar52,uVar27,0);
          if (iVar53 == 0) goto LAB_00130bcc;
          data_00 = (float *)stbi__malloc_mad3(uVar61,uVar52,uVar27,0);
          if (data_00 == (float *)0x0) goto LAB_0012f91b;
          stbi__skip(s,(uint)bVar14);
          uVar56 = (ulong)uVar27;
          if (((sVar15 == '\0') && (bVar17 < 8)) && (data._0_4_ == 0)) {
            uVar54 = 0;
            uVar28 = uVar52;
            while (uVar28 = uVar28 - 1, uVar28 != 0xffffffff) {
              uVar62 = uVar54;
              if ((bVar19 >> 5 & 1) == 0) {
                uVar62 = uVar28;
              }
              stbi__getn(s,(stbi_uc *)((long)data_00 + (long)(int)(uVar62 * uVar27 * uVar61)),
                         uVar27 * uVar61);
              uVar54 = uVar54 + 1;
            }
          }
          else {
            if (sVar15 == '\0') {
              local_8920 = (float *)0x0;
            }
            else {
              if (uVar28 == 0) {
LAB_00131344:
                free(data_00);
                pcVar31 = "bad palette";
                goto LAB_0012de92;
              }
              stbi__skip(s,iVar20);
              local_8920 = (float *)stbi__malloc_mad2(uVar28,uVar27,0);
              if (local_8920 == (float *)0x0) goto LAB_0012f916;
              pfVar43 = local_8920;
              uVar54 = uVar28;
              if (data._0_4_ == 0) {
                iVar20 = stbi__getn(s,(stbi_uc *)local_8920,uVar27 * uVar28);
                if (iVar20 == 0) {
                  free(data_00);
                  data_00 = local_8920;
                  goto LAB_00131344;
                }
              }
              else {
                while (uVar54 != 0) {
                  stbi__tga_read_rgb16(s,(stbi_uc *)pfVar43);
                  pfVar43 = (float *)((long)pfVar43 + uVar56);
                  uVar54 = uVar54 - 1;
                }
              }
            }
            bVar65 = true;
            iVar20 = 0;
            uVar54 = 0;
            pfVar43 = data_00;
            for (uVar48 = 0; uVar48 != uVar52 * uVar61; uVar48 = uVar48 + 1) {
              if (bVar17 < 8) {
LAB_001311ad:
                if (sVar15 == '\0') {
                  if (data._0_4_ == 0) {
                    for (uVar40 = 0; uVar56 != uVar40; uVar40 = uVar40 + 1) {
                      sVar16 = stbi__get8(s);
                      *(stbi_uc *)((long)coutput + uVar40) = sVar16;
                    }
                  }
                  else {
                    stbi__tga_read_rgb16(s,(stbi_uc *)coutput);
                  }
                }
                else {
                  if (bVar18 == 8) {
                    bVar13 = stbi__get8(s);
                    uVar62 = (uint)bVar13;
                  }
                  else {
                    uVar62 = stbi__get16le(s);
                  }
                  if (uVar28 <= uVar62) {
                    uVar62 = 0;
                  }
                  for (uVar40 = 0; uVar56 != uVar40; uVar40 = uVar40 + 1) {
                    *(undefined1 *)((long)coutput + uVar40) =
                         *(undefined1 *)((long)local_8920 + uVar40 + uVar62 * uVar27);
                  }
                }
              }
              else {
                if (iVar20 == 0) {
                  bVar13 = stbi__get8(s);
                  iVar20 = (bVar13 & 0x7f) + 1;
                  uVar54 = (uint)(bVar13 >> 7);
                  goto LAB_001311ad;
                }
                if (uVar54 == 0 || bVar65) {
                  uVar54 = (uint)(uVar54 != 0);
                  goto LAB_001311ad;
                }
                uVar54 = 1;
              }
              for (uVar40 = 0; uVar56 != uVar40; uVar40 = uVar40 + 1) {
                *(undefined1 *)((long)pfVar43 + uVar40) = *(undefined1 *)((long)coutput + uVar40);
              }
              iVar20 = iVar20 + -1;
              pfVar43 = (float *)((long)pfVar43 + uVar56);
              bVar65 = false;
            }
            if ((bVar19 >> 5 & 1) == 0) {
              iVar20 = uVar27 * uVar61;
              iVar53 = (uVar52 - 1) * iVar20;
              uVar28 = 0;
              for (uVar54 = 0; uVar54 != uVar52 + 1 >> 1; uVar54 = uVar54 + 1) {
                pfVar43 = data_00;
                for (iVar51 = iVar20; 0 < iVar51; iVar51 = iVar51 + -1) {
                  uVar5 = *(undefined1 *)((long)pfVar43 + (ulong)uVar28);
                  *(undefined1 *)((long)pfVar43 + (ulong)uVar28) =
                       *(undefined1 *)((long)pfVar43 + (long)iVar53);
                  *(undefined1 *)((long)pfVar43 + (long)iVar53) = uVar5;
                  pfVar43 = (float *)((long)pfVar43 + 1);
                }
                uVar28 = uVar28 + iVar20;
                iVar53 = iVar53 - iVar20;
              }
            }
            free(local_8920);
          }
          if ((2 < uVar27) && (data._0_4_ == 0)) {
            iVar20 = uVar52 * uVar61;
            puVar41 = (undefined1 *)((long)data_00 + 2);
            while (bVar65 = iVar20 != 0, iVar20 = iVar20 + -1, bVar65) {
              uVar5 = puVar41[-2];
              puVar41[-2] = *puVar41;
              *puVar41 = uVar5;
              puVar41 = puVar41 + uVar56;
            }
          }
          if (req_comp == 0) {
            return data_00;
          }
          if (uVar27 == req_comp) {
            return data_00;
          }
LAB_00131121:
          puVar34 = stbi__convert_format((uchar *)data_00,uVar27,req_comp,uVar61,uVar52);
          return puVar34;
        }
      }
      else {
LAB_0012f6bf:
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
      }
      pcVar31 = "unknown image type";
      goto LAB_0012de92;
    }
    y_00 = &s->img_y;
    comp_00 = &s->img_n;
    iVar20 = stbi__pnm_info(s,(int *)s,(int *)y_00,comp_00);
    if (iVar20 == 0) {
      return (void *)0x0;
    }
    if ((*y_00 < 0x1000001) && (s->img_x < 0x1000001)) {
      *x = s->img_x;
      sVar21 = *y_00;
      *y = sVar21;
      iVar20 = *comp_00;
      if (comp != (int *)0x0) {
        *comp = iVar20;
        sVar21 = *y_00;
      }
      sVar25 = s->img_x;
      iVar53 = stbi__mad3sizes_valid(iVar20,sVar25,sVar21,0);
      if (iVar53 != 0) {
        puVar34 = (uchar *)stbi__malloc_mad3(iVar20,sVar25,sVar21,0);
        if (puVar34 != (uchar *)0x0) {
          stbi__getn(s,puVar34,sVar21 * iVar20 * sVar25);
          if (req_comp == 0) {
            return puVar34;
          }
          if (*comp_00 == req_comp) {
            return puVar34;
          }
          puVar34 = stbi__convert_format(puVar34,*comp_00,req_comp,s->img_x,s->img_y);
          return puVar34;
        }
        goto LAB_0012f91b;
      }
    }
  }
LAB_00130bcc:
  pcVar31 = "too large";
LAB_0012de92:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar31;
  return (void *)0x0;
LAB_0012ef73:
  pcVar31 = "bad huffman code";
LAB_0012f5c0:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar31;
  goto LAB_0012f5c9;
LAB_0012df83:
  bVar13 = stbi__get_marker(psVar30);
  goto LAB_0012df20;
LAB_00130798:
  *(char **)(in_FS_OFFSET + -0x10) = "bad file";
  goto LAB_001310e1;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}